

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void __thiscall gnilk::LogManager::Close(LogManager *this)

{
  mutex *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar1;
  pointer puVar2;
  LogSinkInstance *pLVar3;
  int iVar4;
  undefined8 uVar5;
  pointer *__ptr;
  pointer puVar6;
  
  if (this->isInitialized != true) {
    return;
  }
  __mutex = &this->instLock;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    uVar5 = std::__throw_system_error(iVar4);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  this->bQuitSinkThread = true;
  std::thread::join();
  SendToSinks(this);
  (*((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_LogIPCBase[3])();
  this_00 = (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  LogCache::Clear((this->cache).super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  puVar1 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pLVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
               ._M_t.
               super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
               .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl;
      if (pLVar3 != (LogSinkInstance *)0x0) {
        (*pLVar3->_vptr_LogSinkInstance[1])();
      }
      (puVar6->_M_t).
      super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>.
      _M_t.
      super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
      .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl = (LogSinkInstance *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
    (this->sinks).
    super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  this->isInitialized = false;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void LogManager::Close() {
    // This can happen if someone calls close explicitly
    if (!isInitialized) {
        return;
    }
    // event pipe will close through DTOR
    std::lock_guard<std::mutex> lock(instLock);
    // Quit the sink-thread
    bQuitSinkThread = true;
    sinkThread.join();

    // Send any left-overs from the queue
    SendToSinks();

    // Close and clear internal stuff
    ipcHandler->Close();
    ipcHandler = nullptr;   // Must set this reference to null

    cache->Clear();
    sinks.clear();
    // logInstances.clear();    - DO NOT CLEAR THIS!!!!
    isInitialized = false;
}